

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

bool embree::operator<(Token *a,Token *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool local_1;
  
  if (*(int *)in_RDI == *(int *)in_RSI) {
    if (*(int *)in_RDI == 1) {
      local_1 = (char)in_RDI->field_0x4 < (char)in_RSI->field_0x4;
    }
    else if (*(int *)in_RDI == 2) {
      local_1 = *(int *)&in_RDI->field_0x4 < *(int *)&in_RSI->field_0x4;
    }
    else if (*(int *)in_RDI == 3) {
      local_1 = *(float *)&in_RDI->field_0x4 < *(float *)&in_RSI->field_0x4;
    }
    else if (*(int *)in_RDI == 4) {
      local_1 = std::operator<(in_RDI,in_RSI);
    }
    else if (*(int *)in_RDI == 5) {
      local_1 = std::operator<(in_RDI,in_RSI);
    }
    else if (*(int *)in_RDI == 6) {
      local_1 = std::operator<(in_RDI,in_RSI);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = *(int *)in_RDI < *(int *)in_RSI;
  }
  return local_1;
}

Assistant:

bool operator <( const Token& a, const Token& b ) {
      if (a.ty != b.ty) return (int)a.ty < (int)b.ty;
      if (a.ty == TY_CHAR) return a.c < b.c;
      if (a.ty == TY_INT) return a.i < b.i;
      if (a.ty == TY_FLOAT) return a.f < b.f;
      if (a.ty == TY_IDENTIFIER) return a.str < b.str;
      if (a.ty == TY_STRING) return a.str < b.str;
      if (a.ty == TY_SYMBOL) return a.str < b.str;
      return false;
    }